

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int get_escape_len(char *s,int len)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  int len_local;
  char *s_local;
  
  switch(*s) {
  case '\"':
  case '/':
  case '\\':
  case 'b':
  case 'f':
  case 'n':
  case 'r':
  case 't':
    s_local._4_4_ = 1;
    if (len < 2) {
      s_local._4_4_ = -2;
    }
    break;
  default:
    s_local._4_4_ = -1;
    break;
  case 'u':
    if (len < 6) {
      local_2c = -2;
    }
    else {
      iVar1 = is_hex_digit((int)s[1]);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = is_hex_digit((int)s[2]);
        bVar2 = false;
        if (iVar1 != 0) {
          iVar1 = is_hex_digit((int)s[3]);
          bVar2 = false;
          if (iVar1 != 0) {
            iVar1 = is_hex_digit((int)s[4]);
            bVar2 = iVar1 != 0;
          }
        }
      }
      local_2c = -1;
      if (bVar2) {
        local_2c = 5;
      }
    }
    s_local._4_4_ = local_2c;
  }
  return s_local._4_4_;
}

Assistant:

static int get_escape_len(const char *s, int len) {
    switch (*s) {
        case 'u':
            return len < 6 ? JSON_STRING_INCOMPLETE :
                   is_hex_digit(s[1]) && is_hex_digit(s[2]) &&
                   is_hex_digit(s[3]) && is_hex_digit(s[4]) ? 5 : JSON_STRING_INVALID;
        case '"':
        case '\\':
        case '/':
        case 'b':
        case 'f':
        case 'n':
        case 'r':
        case 't':
            return len < 2 ? JSON_STRING_INCOMPLETE : 1;
        default:
            return JSON_STRING_INVALID;
    }
}